

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O0

void __thiscall Random::Random(Random *this)

{
  result_type rVar1;
  Random *this_local;
  
  std::random_device::random_device(&this->_rd);
  rVar1 = std::random_device::operator()(&this->_rd);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->_mt,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution(&this->_dist,1.0,10.0);
  return;
}

Assistant:

Random()
        : _mt(_rd()), _dist(1.0, 10.0)
    { }